

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DeclaratorSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DeclaratorSyntax,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>const&,slang::syntax::EqualsValueClauseSyntax*&>
          (BumpAllocator *this,Token *args,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *args_1,
          EqualsValueClauseSyntax **args_2)

{
  Token name;
  DeclaratorSyntax *this_00;
  
  this_00 = (DeclaratorSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DeclaratorSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (DeclaratorSyntax *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  name.kind = args->kind;
  name._2_1_ = args->field_0x2;
  name.numFlags.raw = (args->numFlags).raw;
  name.rawLen = args->rawLen;
  name.info = args->info;
  slang::syntax::DeclaratorSyntax::DeclaratorSyntax(this_00,name,args_1,*args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }